

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTree.cpp
# Opt level: O0

void __thiscall
RTree::range_search_recursive
          (RTree *this,RTree_node *node,Polygon *query,
          vector<Polygon_*,_std::allocator<Polygon_*>_> *ans)

{
  bool bVar1;
  reference pvVar2;
  reference pvVar3;
  int local_30;
  int local_2c;
  int i_1;
  int i;
  vector<Polygon_*,_std::allocator<Polygon_*>_> *ans_local;
  Polygon *query_local;
  RTree_node *node_local;
  RTree *this_local;
  
  if (node != (RTree_node *)0x0) {
    if ((node->is_leaf & 1U) == 0) {
      for (local_2c = 0; local_2c < node->elements; local_2c = local_2c + 1) {
        pvVar2 = std::vector<d_internal_node,_std::allocator<d_internal_node>_>::operator[]
                           (&node->data_internal_node,(long)local_2c);
        bVar1 = Polygon::intersect_with_BB(pvVar2->region,query);
        if (bVar1) {
          pvVar2 = std::vector<d_internal_node,_std::allocator<d_internal_node>_>::operator[]
                             (&node->data_internal_node,(long)local_2c);
          range_search_recursive(this,pvVar2->child,query,ans);
        }
      }
    }
    else {
      for (local_30 = 0; local_30 < node->elements; local_30 = local_30 + 1) {
        pvVar3 = std::vector<d_leaf,_std::allocator<d_leaf>_>::operator[]
                           (&node->data_leafs,(long)local_30);
        bVar1 = Polygon::is_Within_of(pvVar3->region,query);
        if (bVar1) {
          pvVar3 = std::vector<d_leaf,_std::allocator<d_leaf>_>::operator[]
                             (&node->data_leafs,(long)local_30);
          std::vector<Polygon_*,_std::allocator<Polygon_*>_>::push_back(ans,&pvVar3->polygon);
        }
      }
    }
  }
  return;
}

Assistant:

void RTree::range_search_recursive(RTree_node * node, Polygon & query, std::vector<Polygon *> & ans){
    if(node != nullptr){
        if(!node->is_leaf){
            for(int i = 0; i < node->elements;i++){
                if(node->data_internal_node[i].region->intersect_with_BB(query) ){
                    //ans.push_back(data_query_return(node->data_internal_node[i].region,node->get_level()));
                    range_search_recursive(node->data_internal_node[i].child,query,ans);
                }
            }
        }
        else{
            for(int i = 0; i < node->elements; i++){
                if(node->data_leafs[i].region->is_Within_of(query)){
                    ans.push_back(node->data_leafs[i].polygon);
                }
            }
        }
    }
}